

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdAddTxSignByHandle
              (void *handle,void *create_handle,char *txid,uint32_t vout,int hash_type,
              char *sign_data_hex,bool use_der_encode,int sighash_type,bool sighash_anyone_can_pay,
              bool clear_stack)

{
  pointer *ppuVar1;
  pointer *ppuVar2;
  bool bVar3;
  AddressType AVar4;
  size_t sVar5;
  CfdException *pCVar6;
  uint uVar7;
  initializer_list<cfd::SignParameter> __l;
  bool is_bitcoin;
  SignParameter param;
  SigHashType sighashtype;
  OutPoint outpoint;
  bool local_199;
  void *local_198;
  string local_190;
  SignParameter local_170;
  SigHashType local_f4;
  SignParameter local_e8;
  OutPoint local_70;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_198 = handle;
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&local_170.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)&local_170);
  if ((pointer *)
      local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_170.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x4bd;
    local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdAddTxSignByHandle";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_170,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_170);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_199 = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&local_199);
  if (*(long *)((long)create_handle + 0x18) == 0) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_170);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_e8,txid,(allocator *)&local_190);
  cfd::core::Txid::Txid((Txid *)&local_170,(string *)&local_e8);
  cfd::core::OutPoint::OutPoint(&local_70,(Txid *)&local_170,vout);
  local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__Txid_00723450;
  if ((void *)CONCAT44(local_170.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish._4_4_,
                       local_170.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_170.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     local_170.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._0_4_));
  }
  ppuVar2 = (pointer *)
            ((long)&local_e8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  if ((pointer *)
      local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != ppuVar2) {
    operator_delete(local_e8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  AVar4 = cfd::capi::ConvertHashToAddressType(0);
  if (sign_data_hex == (char *)0x0) {
LAB_00427373:
    local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x4d4;
    local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdAddTxSignByHandle";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_170,kCfdLogLevelWarning,"sign data is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Failed to parameter. sign data is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_170);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(sign_data_hex);
  uVar7 = AVar4 - kP2wshAddress;
  if ((0xfffffffd < uVar7 || use_der_encode) && bVar3) goto LAB_00427373;
  cfd::SignParameter::SignParameter(&local_170);
  if (use_der_encode) {
    cfd::core::SigHashType::Create(&local_f4,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar2;
    sVar5 = strlen(sign_data_hex);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,sign_data_hex,sign_data_hex + sVar5);
    cfd::core::ByteData::ByteData((ByteData *)&local_190,(string *)&local_e8);
    if ((pointer *)
        local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != ppuVar2) {
      operator_delete(local_e8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::core::SigHashType::SigHashType(&local_3c,&local_f4);
    cfd::SignParameter::SignParameter(&local_e8,(ByteData *)&local_190,true,&local_3c);
    cfd::SignParameter::operator=(&local_170,&local_e8);
    local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00722da0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.op_code_.text_data_._M_dataplus._M_p != &local_e8.op_code_.text_data_.field_2) {
      operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
    }
    if (local_e8.related_pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.related_pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
      operator_delete(local_e8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00427234;
  }
  else {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    sVar5 = strlen(sign_data_hex);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,sign_data_hex,sign_data_hex + sVar5);
    cfd::core::SigHashType::SigHashType(&local_48,kSigHashAll,false,false);
    cfd::SignParameter::SignParameter(&local_e8,&local_190,false,&local_48);
    cfd::SignParameter::operator=(&local_170,&local_e8);
    local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00722da0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.op_code_.text_data_._M_dataplus._M_p != &local_e8.op_code_.text_data_.field_2) {
      operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
    }
    if (local_e8.related_pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.related_pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
      operator_delete(local_e8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p == &local_190.field_2) goto LAB_00427234;
  }
  operator_delete(local_190._M_dataplus._M_p);
LAB_00427234:
  cfd::SignParameter::SignParameter(&local_e8,&local_170);
  __l._M_len = 1;
  __l._M_array = &local_e8;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_190,__l,
             (allocator_type *)&local_f4);
  local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00722da0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.op_code_.text_data_._M_dataplus._M_p != &local_e8.op_code_.text_data_.field_2) {
    operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_e8.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_e8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_199 == true) {
    cfd::TransactionContext::AddSign
              ((TransactionContext *)
               *(ConfidentialTransactionContext **)((long)create_handle + 0x18),&local_70,
               (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_190,
               uVar7 < 0xfffffffe,clear_stack);
  }
  else {
    cfd::ConfidentialTransactionContext::AddSign
              (*(ConfidentialTransactionContext **)((long)create_handle + 0x18),&local_70,
               (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_190,
               uVar7 < 0xfffffffe,clear_stack);
  }
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_190);
  local_170.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00722da0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.op_code_.text_data_._M_dataplus._M_p != &local_170.op_code_.text_data_.field_2) {
    operator_delete(local_170.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_170.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((undefined **)
      local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (undefined **)0x0) {
    operator_delete(local_170.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_70.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_70.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdAddTxSignByHandle(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int hash_type, const char* sign_data_hex, bool use_der_encode,
    int sighash_type, bool sighash_anyone_can_pay, bool clear_stack) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    }
    OutPoint outpoint(Txid(txid), vout);

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    bool is_witness = true;
    if ((addr_type == AddressType::kP2shAddress) ||
        (addr_type == AddressType::kP2pkhAddress)) {
      is_witness = false;
    }

    if ((sign_data_hex == nullptr) ||
        (IsEmptyString(sign_data_hex) && (use_der_encode || !is_witness))) {
      warn(CFD_LOG_SOURCE, "sign data is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sign data is null or empty.");
    }

    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(sign_data_hex));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(sign_data_hex));
    }
    std::vector<SignParameter> sign_list = {param};

    if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      tx->AddSign(outpoint, sign_list, is_witness, clear_stack);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      tx->AddSign(outpoint, sign_list, is_witness, clear_stack);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}